

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O0

void pnga_set_memory_dev(Integer g_a,char *device)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  char *in_RSI;
  long in_RDI;
  int ilen;
  int i;
  int len;
  Integer ga_handle;
  Integer in_stack_00000178;
  char *in_stack_00000180;
  int local_24;
  int local_20;
  
  sVar3 = strlen(in_RSI);
  iVar1 = (int)sVar3;
  if (0x1f < iVar1) {
    pnga_error(in_stack_00000180,in_stack_00000178);
  }
  for (local_20 = 0; local_20 < iVar1; local_20 = local_20 + 1) {
    iVar2 = tolower((int)in_RSI[local_20]);
    in_RSI[local_20] = (char)iVar2;
  }
  local_24 = 0;
  for (local_20 = 0; local_20 < iVar1; local_20 = local_20 + 1) {
    if (in_RSI[local_20] != ' ') {
      in_RSI[local_24] = in_RSI[local_20];
      local_24 = local_24 + 1;
    }
  }
  if ((iVar1 < local_24) && (local_24 < 0x1f)) {
    in_RSI[local_24] = '\0';
  }
  GA[in_RDI + 1000].mem_dev_set = 1;
  strcpy(GA[in_RDI + 1000].mem_dev,in_RSI);
  return;
}

Assistant:

void pnga_set_memory_dev(Integer g_a, char *device) {
  Integer ga_handle = g_a + GA_OFFSET;
  int len = strlen(device);
  int i, ilen;
  if (len>FNAM) {
    pnga_error("Illegal memory device name specified. Device name exceeds length: ",
        FNAM);
  }
  /* convert device name to lower case */
  for (i=0; i<len; i++) {
    device[i] = tolower(device[i]);
  }
  /* remove blanks */
  ilen = 0;
  for (i=0; i<len; i++) {
    if (device[i] != ' ') {
      device [ilen] = device[i];
      ilen++;
    }
  }
  if (ilen > len && ilen < FNAM) device[ilen] = '\0';
  GA[ga_handle].mem_dev_set = 1;
  strcpy(GA[ga_handle].mem_dev,device);
}